

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode http_rw_hd(Curl_easy *data,char *hd,size_t hdlen,char *buf_remain,size_t blen,
                   size_t *pconsumed)

{
  ConnectBits *pCVar1;
  undefined1 *puVar2;
  int *piVar3;
  byte bVar4;
  char cVar5;
  curlntlm cVar6;
  curl_trc_feat *pcVar7;
  _Bool _Var8;
  CURLcode CVar9;
  CURLcode CVar10;
  int iVar11;
  statusline sVar12;
  uint uVar13;
  char *pcVar14;
  size_t hdlen_00;
  void *pvVar15;
  Curl_creader *pCVar16;
  char *pcVar17;
  uint uVar18;
  int iVar19;
  connectdata *pcVar20;
  dynbuf last_header;
  dynbuf local_50;
  
  buf_remain[0] = '\0';
  buf_remain[1] = '\0';
  buf_remain[2] = '\0';
  buf_remain[3] = '\0';
  buf_remain[4] = '\0';
  buf_remain[5] = '\0';
  buf_remain[6] = '\0';
  buf_remain[7] = '\0';
  if ((*hd == '\r') || (*hd == '\n')) {
    Curl_dyn_init(&local_50,hdlen + 1);
    CVar9 = Curl_dyn_addn(&local_50,hd,hdlen);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    Curl_dyn_reset(&(data->state).headerb);
    pcVar14 = Curl_dyn_ptr(&local_50);
    hdlen_00 = Curl_dyn_len(&local_50);
    pcVar20 = data->conn;
    if ((((data->req).upgr101 == UPGR101_RECEIVED) && (pcVar20->httpversion != '\x14')) &&
       ((((data->set).field_0x8cd & 0x10) != 0 &&
        ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))))
       ) {
      Curl_infof(data,"Lying server, not serving HTTP/2");
    }
    uVar13 = (data->req).httpcode;
    if (pcVar14 != (char *)0x0 && (int)uVar13 < 200) {
      CVar9 = http_write_header(data,pcVar14,hdlen_00);
      if (CVar9 != CURLE_OK) goto LAB_00135801;
      uVar13 = (data->req).httpcode;
      pcVar14 = (char *)0x0;
    }
    if ((int)uVar13 < 100) {
      Curl_failf(data,"Unsupported response code in HTTP response");
LAB_001357e4:
      CVar9 = CURLE_UNSUPPORTED_PROTOCOL;
    }
    else {
      uVar18 = *(uint *)&(data->req).field_0xd9;
      if (uVar13 < 200) {
        *(uint *)&(data->req).field_0xd9 = uVar18 | 1;
        (data->req).headerline = 0;
        CVar9 = CURLE_OK;
        if ((char)uVar13 == 'e') {
          if (pcVar20->httpversion == '\v') {
            if ((data->req).upgr101 == UPGR101_H2) {
              if ((((data->set).field_0x8cd & 0x10) != 0) &&
                 ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar7->log_level)))) {
                Curl_infof(data,"Received 101, Switching to HTTP/2");
              }
              (data->req).upgr101 = UPGR101_RECEIVED;
              pCVar1 = &data->conn->bits;
              *pCVar1 = (ConnectBits)((ulong)*pCVar1 & 0xffffffffffdfffff);
              puVar2 = &(data->req).field_0xd9;
              *puVar2 = *puVar2 | 1;
              (data->req).headerline = 0;
              goto LAB_001357e4;
            }
            *(uint *)&(data->req).field_0xd9 = uVar18 & 0xfffffffe;
          }
          else {
            Curl_failf(data,"unexpected 101 response code");
            CVar9 = CURLE_WEIRD_SERVER_REPLY;
          }
        }
        else {
          CVar9 = CURLE_OK;
          if ((uVar13 & 0xff) == 100) {
            Curl_http_exp100_got100(data);
          }
        }
      }
      else {
        *(uint *)&(data->req).field_0xd9 = uVar18 & 0xfffffffe;
        if ((data->req).upgr101 == UPGR101_H2) {
          pCVar1 = &data->conn->bits;
          *pCVar1 = (ConnectBits)((ulong)*pCVar1 & 0xffffffffffdfffff);
          Curl_multi_connchanged(data->multi);
        }
        if ((((((data->req).size == -1) && (((data->req).field_0xda & 0x10) == 0)) &&
             (((ulong)pcVar20->bits & 0x20) == 0)) &&
            ((pcVar20->httpversion == '\v' && ((pcVar20->handler->protocol & 0x40000) == 0)))) &&
           ((data->state).httpreq != '\x05')) {
          if ((((data->set).field_0x8cd & 0x10) != 0) &&
             ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
              (0 < pcVar7->log_level)))) {
            Curl_infof(data,"no chunk, no close, no size. Assume close to signal end");
          }
          Curl_conncontrol(pcVar20,2);
        }
        uVar13 = (data->req).httpcode;
        uVar18 = uVar13;
        if (((ulong)pcVar20->bits & 0x20) != 0) {
          if (uVar13 == 0x197) {
            uVar18 = 0x197;
            cVar6 = pcVar20->proxy_ntlm_state;
          }
          else {
            if (uVar13 != 0x191) goto LAB_00135e2f;
            uVar18 = 0x191;
            cVar6 = pcVar20->http_ntlm_state;
          }
          if (cVar6 == NTLMSTATE_TYPE2) {
            if ((((data->set).field_0x8cd & 0x10) != 0) &&
               ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                (0 < pcVar7->log_level)))) {
              Curl_infof(data,"Connection closure while negotiating auth (HTTP 1.0?)");
              uVar13 = (data->req).httpcode;
            }
            puVar2 = &(data->state).field_0x744;
            *puVar2 = *puVar2 | 0x20;
            uVar18 = uVar13;
          }
        }
LAB_00135e2f:
        _Var8 = http_should_fail(data,uVar18);
        if (_Var8) {
          Curl_failf(data,"The requested URL returned error: %d",(ulong)uVar18);
          CVar9 = CURLE_HTTP_RETURNED_ERROR;
        }
        else {
          CVar9 = Curl_http_auth_act(data);
          if (CVar9 == CURLE_OK) {
            if (299 < (data->req).httpcode) {
              if ((((((data->req).field_0xdb & 4) == 0) && (((ulong)pcVar20->bits & 0x20) == 0)) &&
                  (_Var8 = Curl_creader_will_rewind(data), !_Var8)) &&
                 (((byte)((data->state).httpreq - 1) < 4 &&
                  (_Var8 = Curl_req_done_sending(data), !_Var8)))) {
                if (((data->req).httpcode == 0x1a1) &&
                   (pCVar16 = Curl_creader_get_by_type(data,&cr_exp100),
                   pCVar16 != (Curl_creader *)0x0)) {
                  if ((((data->req).writebytecount == 0) &&
                      (pCVar16 = Curl_creader_get_by_type(data,&cr_exp100),
                      pCVar16 != (Curl_creader *)0x0)) && (*(int *)((long)pCVar16->ctx + 0x30) == 1)
                     ) {
                    if ((((data->set).field_0x8cd & 0x10) != 0) &&
                       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar7->log_level)))) {
                      Curl_infof(data,"Got HTTP failure 417 while waiting for a 100");
                    }
                  }
                  else {
                    if ((((data->set).field_0x8cd & 0x10) != 0) &&
                       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar7->log_level)))) {
                      Curl_infof(data,"Got HTTP failure 417 while sending data");
                    }
                    Curl_conncontrol(pcVar20,2);
                    http_perhapsrewind(data,pcVar20);
                  }
                  puVar2 = &(data->state).field_0x744;
                  *puVar2 = *puVar2 | 0x80;
                  pcVar17 = (*Curl_cstrdup)((data->state).url);
                  (data->req).newurl = pcVar17;
                  Curl_req_abort_sending(data);
                }
                else {
                  uVar13 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
                  if ((uVar13 >> 0x14 & 1) == 0) {
                    if (((uVar13 >> 0x1c & 1) != 0) &&
                       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar7->log_level)))) {
                      Curl_infof(data,"HTTP error before end of send, stop sending");
                    }
                    Curl_conncontrol(pcVar20,2);
                    CVar9 = Curl_req_abort_sending(data);
                    if (CVar9 != CURLE_OK) goto LAB_001357e9;
                  }
                  else {
                    if (((uVar13 >> 0x1c & 1) != 0) &&
                       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar7->log_level)))) {
                      Curl_infof(data,"HTTP error before end of send, keep sending");
                    }
                    http_exp100_send_anyway(data);
                  }
                }
              }
              _Var8 = Curl_creader_will_rewind(data);
              if ((_Var8) && (_Var8 = Curl_req_done_sending(data), !_Var8)) {
                if ((((data->set).field_0x8cd & 0x10) != 0) &&
                   ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar7->log_level)))) {
                  Curl_infof(data,"Keep sending data to get tossed away");
                }
                piVar3 = &(data->req).keepon;
                *(byte *)piVar3 = (byte)*piVar3 | 2;
              }
            }
            uVar13 = *(uint *)&(data->req).field_0xd9;
            if ((uVar13 >> 0x11 & 1) != 0) {
              uVar13 = uVar13 | 8;
              *(uint *)&(data->req).field_0xd9 = uVar13;
            }
            if ((data->req).maxdownload == 0) {
              *(uint *)&(data->req).field_0xd9 = uVar13 | 8;
            }
            CVar9 = Curl_http_firstwrite(data);
            if (CVar9 == CURLE_OK) {
              CVar9 = Curl_http_size(data);
            }
          }
        }
      }
    }
LAB_001357e9:
    if ((pcVar14 != (char *)0x0) &&
       (CVar10 = http_write_header(data,pcVar14,hdlen_00), CVar9 == CURLE_OK)) {
      CVar9 = CVar10;
    }
LAB_00135801:
    Curl_dyn_free(&local_50);
    return CVar9;
  }
  iVar11 = (data->req).headerline;
  (data->req).headerline = iVar11 + 1;
  iVar19 = 4;
  if (iVar11 == 0) {
    (data->req).httpversion = 0;
    pcVar20 = data->conn;
    uVar13 = pcVar20->handler->protocol;
    pcVar14 = hd;
    if ((uVar13 & 3) == 0) {
      if ((uVar13 >> 0x12 & 1) != 0) {
        for (; (*pcVar14 == ' ' || (*pcVar14 == '\t')); pcVar14 = pcVar14 + 1) {
        }
        iVar11 = strncmp(pcVar14,"RTSP/",5);
        if (iVar11 == 0) {
          if (9 < (byte)(pcVar14[5] - 0x30U)) {
            return CURLE_WEIRD_SERVER_REPLY;
          }
          if (pcVar14[6] != '.') {
            return CURLE_WEIRD_SERVER_REPLY;
          }
          if (9 < (byte)(pcVar14[7] - 0x30U)) {
            return CURLE_WEIRD_SERVER_REPLY;
          }
          if ((pcVar14[8] != ' ') && (pcVar14[8] != '\t')) {
            return CURLE_WEIRD_SERVER_REPLY;
          }
          if (9 < (byte)(pcVar14[9] - 0x30U)) {
            return CURLE_WEIRD_SERVER_REPLY;
          }
          if (9 < (byte)(pcVar14[10] - 0x30U)) {
            return CURLE_WEIRD_SERVER_REPLY;
          }
          if (9 < (byte)(pcVar14[0xb] - 0x30U)) {
            return CURLE_WEIRD_SERVER_REPLY;
          }
          (data->req).httpcode =
               (uint)(byte)(pcVar14[0xb] - 0x30U) +
               (uint)(byte)(pcVar14[10] * '\n' + 0x20) + (uint)(byte)(pcVar14[9] - 0x30U) * 100;
          cVar5 = pcVar14[0xc];
          if (((cVar5 != '\t') && (cVar5 != ' ')) && (3 < (byte)(cVar5 - 10U))) {
            return CURLE_WEIRD_SERVER_REPLY;
          }
          (data->req).httpversion = 0xb;
          goto LAB_001359b3;
        }
      }
    }
    else {
      for (; (*pcVar14 == ' ' || (*pcVar14 == '\t')); pcVar14 = pcVar14 + 1) {
      }
      iVar11 = strncmp(pcVar14,"HTTP/",5);
      if (iVar11 == 0) {
        bVar4 = pcVar14[5];
        if (1 < bVar4 - 0x32) {
          if (bVar4 != 0x31) {
            pcVar14 = "Unsupported HTTP version in response";
            goto LAB_00135dd0;
          }
          if (((pcVar14[6] == '.') && ((pcVar14[7] & 0xfeU) == 0x30)) &&
             ((pcVar14[8] == ' ' || (pcVar14[8] == '\t')))) {
            (data->req).httpversion = (byte)pcVar14[7] - 0x26;
            if ((((byte)(pcVar14[9] - 0x30U) < 10) && ((byte)(pcVar14[10] - 0x30U) < 10)) &&
               ((byte)(pcVar14[0xb] - 0x30U) < 10)) {
              (data->req).httpcode =
                   (uint)(byte)(pcVar14[0xb] - 0x30U) +
                   (uint)(byte)(pcVar14[10] * '\n' + 0x20) + (uint)(byte)(pcVar14[9] - 0x30U) * 100;
              cVar5 = pcVar14[0xc];
              if (((cVar5 == '\t') || (cVar5 == ' ')) || ((byte)(cVar5 - 10U) < 4))
              goto LAB_001359b3;
            }
          }
          pcVar14 = "Unsupported HTTP/1 subversion in response";
LAB_00135dd0:
          Curl_failf(data,pcVar14);
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        if ((pcVar14[6] == ' ') || (pcVar14[6] == '\t')) {
          (data->req).httpversion = ((uint)bVar4 + (uint)bVar4 * 4) * 2 + -0x1e0;
          if (((byte)(pcVar14[7] - 0x30U) < 10) &&
             (((byte)(pcVar14[8] - 0x30U) < 10 && ((byte)(pcVar14[9] - 0x30U) < 10)))) {
            (data->req).httpcode =
                 (uint)(byte)(pcVar14[9] - 0x30U) +
                 (uint)(byte)(pcVar14[8] * '\n' + 0x20) + (uint)(byte)(pcVar14[7] - 0x30U) * 100;
            cVar5 = pcVar14[10];
            if ((cVar5 == '\t') || ((cVar5 == ' ' || ((byte)(cVar5 - 10U) < 4)))) goto LAB_001359b3;
          }
        }
      }
      sVar12 = checkhttpprefix(data,hd,hdlen);
      if (sVar12 == STATUS_DONE) {
        (data->req).httpversion = 10;
        (data->req).httpcode = 200;
        pcVar20 = data->conn;
LAB_001359b3:
        CVar9 = Curl_http_statusline(data,pcVar20);
        if (CVar9 != CURLE_OK) {
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        iVar19 = 0xc;
        goto LAB_00135829;
      }
    }
    puVar2 = &(data->req).field_0xd9;
    *puVar2 = *puVar2 & 0xfe;
  }
  else {
LAB_00135829:
    pvVar15 = memchr(hd,0,hdlen);
    if (pvVar15 == (void *)0x0) {
      iVar11 = (data->req).headerline;
      if ((iVar11 < 2) ||
         ((((*hd == ' ' || (*hd == '\t')) && (iVar11 != 2)) ||
          (pvVar15 = memchr(hd,0x3a,hdlen), pvVar15 != (void *)0x0)))) {
        CVar9 = Curl_http_header(data,hd,hdlen);
        if (CVar9 != CURLE_OK) {
          return CVar9;
        }
        Curl_debug(data,CURLINFO_HEADER_IN,hd,hdlen);
        iVar11 = iVar19 + 0x20;
        if (99 < (data->req).httpcode - 100U) {
          iVar11 = iVar19;
        }
        CVar9 = Curl_client_write(data,iVar11,hd,hdlen);
        if (CVar9 != CURLE_OK) {
          return CVar9;
        }
        CVar9 = Curl_bump_headersize(data,hdlen,false);
        return CVar9;
      }
      pcVar14 = "Header without colon";
    }
    else {
      pcVar14 = "Nul byte in header";
    }
    Curl_failf(data,pcVar14);
  }
  return CURLE_WEIRD_SERVER_REPLY;
}

Assistant:

static CURLcode http_rw_hd(struct Curl_easy *data,
                           const char *hd, size_t hdlen,
                           const char *buf_remain, size_t blen,
                           size_t *pconsumed)
{
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  int writetype;

  *pconsumed = 0;
  if((0x0a == *hd) || (0x0d == *hd)) {
    /* Empty header line means end of headers! */
    struct dynbuf last_header;
    size_t consumed;

    Curl_dyn_init(&last_header, hdlen + 1);
    result = Curl_dyn_addn(&last_header, hd, hdlen);
    if(result)
      return result;

    /* analyze the response to find out what to do. */
    /* Caveat: we clear anything in the header brigade, because a
     * response might switch HTTP version which may call use recursively.
     * Not nice, but that is currently the way of things. */
    Curl_dyn_reset(&data->state.headerb);
    result = http_on_response(data, Curl_dyn_ptr(&last_header),
                              Curl_dyn_len(&last_header),
                              buf_remain, blen, &consumed);
    *pconsumed += consumed;
    Curl_dyn_free(&last_header);
    return result;
  }

  /*
   * Checks for special headers coming up.
   */

  writetype = CLIENTWRITE_HEADER;
  if(!k->headerline++) {
    /* This is the first header, it MUST be the error code line
       or else we consider this to be the body right away! */
    bool fine_statusline = FALSE;

    k->httpversion = 0; /* Do not know yet */
    if(data->conn->handler->protocol & PROTO_FAMILY_HTTP) {
      /*
       * https://datatracker.ietf.org/doc/html/rfc7230#section-3.1.2
       *
       * The response code is always a three-digit number in HTTP as the spec
       * says. We allow any three-digit number here, but we cannot make
       * guarantees on future behaviors since it is not within the protocol.
       */
      const char *p = hd;

      while(*p && ISBLANK(*p))
        p++;
      if(!strncmp(p, "HTTP/", 5)) {
        p += 5;
        switch(*p) {
        case '1':
          p++;
          if((p[0] == '.') && (p[1] == '0' || p[1] == '1')) {
            if(ISBLANK(p[2])) {
              k->httpversion = 10 + (p[1] - '0');
              p += 3;
              if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
                k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
                  (p[2] - '0');
                p += 3;
                if(ISSPACE(*p))
                  fine_statusline = TRUE;
              }
            }
          }
          if(!fine_statusline) {
            failf(data, "Unsupported HTTP/1 subversion in response");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          break;
        case '2':
        case '3':
          if(!ISBLANK(p[1]))
            break;
          k->httpversion = (*p - '0') * 10;
          p += 2;
          if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
            k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
              (p[2] - '0');
            p += 3;
            if(!ISSPACE(*p))
              break;
            fine_statusline = TRUE;
          }
          break;
        default: /* unsupported */
          failf(data, "Unsupported HTTP version in response");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
      }

      if(!fine_statusline) {
        /* If user has set option HTTP200ALIASES,
           compare header line against list of aliases
        */
        statusline check = checkhttpprefix(data, hd, hdlen);
        if(check == STATUS_DONE) {
          fine_statusline = TRUE;
          k->httpcode = 200;
          k->httpversion = 10;
        }
      }
    }
    else if(data->conn->handler->protocol & CURLPROTO_RTSP) {
      const char *p = hd;
      while(*p && ISBLANK(*p))
        p++;
      if(!strncmp(p, "RTSP/", 5)) {
        p += 5;
        if(ISDIGIT(*p)) {
          p++;
          if((p[0] == '.') && ISDIGIT(p[1])) {
            if(ISBLANK(p[2])) {
              p += 3;
              if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
                k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
                  (p[2] - '0');
                p += 3;
                if(ISSPACE(*p)) {
                  fine_statusline = TRUE;
                  k->httpversion = 11; /* RTSP acts like HTTP 1.1 */
                }
              }
            }
          }
        }
        if(!fine_statusline)
          return CURLE_WEIRD_SERVER_REPLY;
      }
    }

    if(fine_statusline) {
      result = Curl_http_statusline(data, data->conn);
      if(result)
        return result;
      writetype |= CLIENTWRITE_STATUS;
    }
    else {
      k->header = FALSE;   /* this is not a header line */
      return CURLE_WEIRD_SERVER_REPLY;
    }
  }

  result = verify_header(data, hd, hdlen);
  if(result)
    return result;

  result = Curl_http_header(data, hd, hdlen);
  if(result)
    return result;

  /*
   * Taken in one (more) header. Write it to the client.
   */
  Curl_debug(data, CURLINFO_HEADER_IN, (char *)hd, hdlen);

  if(k->httpcode/100 == 1)
    writetype |= CLIENTWRITE_1XX;
  result = Curl_client_write(data, writetype, hd, hdlen);
  if(result)
    return result;

  result = Curl_bump_headersize(data, hdlen, FALSE);
  if(result)
    return result;

  return CURLE_OK;
}